

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

any * __thiscall dap::any::operator=(any *this,number *val)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TypeInfo *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  bVar1 = is<dap::number>(this);
  if (bVar1) {
    *(double *)this->value = val->val;
  }
  else {
    reset(this);
    pTVar4 = TypeOf<dap::number>::type();
    this->type = pTVar4;
    iVar2 = (*pTVar4->_vptr_TypeInfo[3])(pTVar4);
    iVar3 = (*this->type->_vptr_TypeInfo[4])();
    alloc(this,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
    (*this->type->_vptr_TypeInfo[6])(this->type,this->value,val);
  }
  return this;
}

Assistant:

any& any::operator=(const T& val) {
  if (!is<T>()) {
    reset();
    type = TypeOf<T>::type();
    alloc(type->size(), type->alignment());
    type->copyConstruct(value, &val);
  } else {
#ifdef __clang_analyzer__
    assert(value != nullptr);
#endif
    *reinterpret_cast<T*>(value) = val;
  }
  return *this;
}